

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O3

_Bool ggml_gallocr_reserve_n
                (ggml_gallocr_t galloc,ggml_cgraph *graph,int *node_buffer_ids,int *leaf_buffer_ids)

{
  ggml_hash_set *hash_set;
  free_block *pfVar1;
  ggml_dyn_tallocr **ppgVar2;
  ggml_dyn_tallocr *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  size_t sVar6;
  uint uVar7;
  int iVar8;
  hash_node *phVar9;
  ulong uVar10;
  node_alloc *pnVar11;
  leaf_alloc *plVar12;
  size_t sVar13;
  ggml_backend_buffer_t pgVar14;
  char *pcVar15;
  uint uVar16;
  ulong uVar17;
  free_block *pfVar18;
  ggml_dyn_tallocr *pgVar19;
  ggml_backend_buffer_t *ppgVar20;
  int iVar21;
  int j;
  long lVar22;
  ggml_tensor *t;
  int *piVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  free_block *pfVar27;
  free_block *pfVar28;
  size_t sVar29;
  node_alloc *pnVar30;
  long lVar31;
  ggml_hash_set local_48;
  
  uVar17 = (long)graph->n_leafs + (long)graph->n_nodes;
  uVar17 = (uVar17 >> 2) + uVar17;
  hash_set = &galloc->hash_set;
  if ((galloc->hash_set).size < uVar17) {
    ggml_hash_set_free(hash_set);
    ggml_hash_set_new(&local_48,uVar17);
    (galloc->hash_set).keys = local_48.keys;
    hash_set->size = local_48.size;
    (galloc->hash_set).used = local_48.used;
    if ((galloc->hash_set).keys == (ggml_tensor **)0x0) {
      pcVar15 = "galloc->hash_set.keys != NULL";
      iVar21 = 0x2aa;
      goto LAB_001246ab;
    }
    free(galloc->hash_values);
    phVar9 = (hash_node *)malloc((galloc->hash_set).size << 5);
    galloc->hash_values = phVar9;
    if (phVar9 == (hash_node *)0x0) {
      pcVar15 = "galloc->hash_values != NULL";
      iVar21 = 0x2ae;
      goto LAB_001246ab;
    }
  }
  iVar21 = galloc->n_buffers;
  if (0 < (long)iVar21) {
    ppgVar2 = galloc->buf_tallocs;
    lVar25 = 0;
    do {
      pgVar3 = ppgVar2[lVar25];
      pgVar3->n_free_blocks = 1;
      pgVar3->free_blocks[0].offset = 0;
      pgVar3->free_blocks[0].size = 0x7fffffffffffffff;
      pgVar3->max_size = 0;
      lVar25 = lVar25 + 1;
    } while (iVar21 != lVar25);
  }
  ggml_hash_set_reset(hash_set);
  memset(galloc->hash_values,0,(galloc->hash_set).size << 5);
  if (0 < graph->n_leafs) {
    lVar25 = 0;
    do {
      iVar21 = 0;
      if (leaf_buffer_ids != (int *)0x0) {
        iVar21 = leaf_buffer_ids[lVar25];
      }
      ggml_gallocr_allocate_node(galloc,graph->leafs[lVar25],iVar21);
      lVar25 = lVar25 + 1;
    } while (lVar25 < graph->n_leafs);
  }
  iVar21 = graph->n_nodes;
  if (0 < iVar21) {
    lVar25 = 0;
    do {
      pgVar4 = graph->nodes[lVar25];
      if ((pgVar4->view_src != (ggml_tensor *)0x0) && (pgVar4->op != GGML_OP_NONE)) {
        phVar9 = ggml_gallocr_hash_get(galloc,pgVar4->view_src);
        phVar9->n_views = phVar9->n_views + 1;
      }
      if ((pgVar4->flags & 1) != 0) {
        if (node_buffer_ids == (int *)0x0) {
          iVar21 = 0;
        }
        else {
          iVar21 = node_buffer_ids[lVar25];
        }
        ggml_gallocr_allocate_node(galloc,graph->nodes[lVar25],iVar21);
      }
      lVar22 = 0;
      do {
        pgVar5 = pgVar4->src[lVar22];
        if (pgVar5 != (ggml_tensor *)0x0) {
          phVar9 = ggml_gallocr_hash_get(galloc,pgVar5);
          phVar9->n_children = phVar9->n_children + 1;
          if ((pgVar5->flags & 1) != 0) {
            if (node_buffer_ids == (int *)0x0) {
              iVar21 = 0;
            }
            else {
              iVar21 = node_buffer_ids[lVar25];
            }
            ggml_gallocr_allocate_node(galloc,pgVar5,iVar21);
          }
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != 10);
      lVar25 = lVar25 + 1;
      iVar21 = graph->n_nodes;
    } while (lVar25 < iVar21);
    if (0 < iVar21) {
      lVar25 = 0;
      do {
        iVar21 = 0;
        if (node_buffer_ids != (int *)0x0) {
          iVar21 = node_buffer_ids[lVar25];
        }
        pgVar4 = graph->nodes[lVar25];
        lVar22 = 0x13;
        do {
          if ((ggml_tensor *)pgVar4->ne[lVar22 + -2] != (ggml_tensor *)0x0) {
            ggml_gallocr_allocate_node(galloc,(ggml_tensor *)pgVar4->ne[lVar22 + -2],iVar21);
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 0x1d);
        ggml_gallocr_allocate_node(galloc,pgVar4,iVar21);
        lVar22 = 0;
        do {
          pgVar5 = pgVar4->src[lVar22];
          if (pgVar5 != (ggml_tensor *)0x0) {
            phVar9 = ggml_gallocr_hash_get(galloc,pgVar5);
            phVar9->n_children = phVar9->n_children + -1;
            if ((phVar9->n_children == 0) && (phVar9->n_views == 0)) {
              t = pgVar5->view_src;
              if (t == (ggml_tensor *)0x0) {
                t = pgVar5;
                if (phVar9->allocated == true) goto LAB_001240ca;
              }
              else {
                phVar9 = ggml_gallocr_hash_get(galloc,t);
                piVar23 = &phVar9->n_views;
                *piVar23 = *piVar23 + -1;
                if (((*piVar23 == 0) && (phVar9->n_children == 0)) && (phVar9->allocated != false))
                {
LAB_001240ca:
                  if ((t->flags & 2) == 0) {
                    phVar9 = ggml_gallocr_hash_get(galloc,t);
                    uVar17 = phVar9->offset;
                    pgVar3 = galloc->buf_tallocs[phVar9->buffer_id];
                    sVar13 = ggml_backend_buft_get_alloc_size(galloc->bufts[phVar9->buffer_id],t);
                    uVar10 = pgVar3->alignment;
                    sVar13 = (uVar10 - sVar13 % uVar10) % uVar10 + sVar13;
                    uVar7 = pgVar3->n_free_blocks;
                    uVar10 = (ulong)uVar7;
                    pfVar1 = pgVar3->free_blocks;
                    if ((int)uVar7 < 1) {
                      uVar24 = 0;
                    }
                    else {
                      uVar24 = (ulong)(uVar7 - 1);
                      pfVar27 = pgVar3->free_blocks;
                      pfVar18 = pgVar3->free_blocks + 2;
                      uVar26 = 0;
                      pfVar28 = pfVar1;
                      do {
                        pfVar27 = pfVar27 + 1;
                        sVar6 = pfVar28->offset;
                        sVar29 = pfVar28->size;
                        iVar21 = (int)uVar26;
                        if (sVar29 + sVar6 == uVar17) {
                          sVar29 = sVar29 + sVar13;
                          pfVar28->size = sVar29;
                          iVar8 = uVar7 - 1;
                          if ((iVar21 < iVar8) && (sVar6 + sVar29 == pfVar28[1].offset)) {
                            pfVar28->size = sVar29 + pfVar28[1].size;
                            pgVar3->n_free_blocks = iVar8;
                            if (iVar21 + 1 < iVar8) {
                              uVar17 = 1;
                              do {
                                sVar13 = pfVar18->size;
                                pfVar18[-1].offset = pfVar18->offset;
                                pfVar18[-1].size = sVar13;
                                uVar17 = uVar17 + 1;
                                pfVar18 = pfVar18 + 1;
                              } while (uVar24 != uVar17);
                            }
                          }
                          goto LAB_001241ed;
                        }
                        if (sVar13 + uVar17 == sVar6) {
                          pfVar28->offset = uVar17;
                          pfVar28->size = sVar29 + sVar13;
                          if (uVar26 != 0) {
                            uVar16 = iVar21 - 1;
                            sVar6 = pgVar3->free_blocks[uVar16].size;
                            if (pfVar1[uVar16].offset + sVar6 == uVar17) {
                              pfVar1[uVar16].size = sVar6 + sVar29 + sVar13;
                              pgVar3->n_free_blocks = uVar7 - 1;
                              if (iVar21 < (int)(uVar7 - 1)) {
                                do {
                                  sVar13 = pfVar27->size;
                                  pfVar27[-1].offset = pfVar27->offset;
                                  pfVar27[-1].size = sVar13;
                                  pfVar27 = pfVar27 + 1;
                                  uVar24 = uVar24 - 1;
                                } while (uVar24 != 0);
                              }
                            }
                          }
                          goto LAB_001241ed;
                        }
                        uVar26 = uVar26 + 1;
                        pfVar28 = pfVar28 + 1;
                        uVar24 = uVar24 - 1;
                        pfVar18 = pfVar18 + 1;
                      } while (uVar10 != uVar26);
                      if (0xff < (int)uVar7) {
                        pcVar15 = "alloc->n_free_blocks < MAX_FREE_BLOCKS && \"out of free blocks\""
                        ;
                        iVar21 = 0x117;
                        goto LAB_001246ab;
                      }
                      uVar24 = 0;
                      pfVar18 = pfVar1;
                      do {
                        if (uVar17 <= pfVar18->offset) {
                          if ((int)uVar24 < (int)uVar7) {
                            pgVar19 = (ggml_dyn_tallocr *)(pgVar3->free_blocks + uVar10);
                            do {
                              uVar10 = uVar10 - 1;
                              sVar6 = *(size_t *)((long)(pgVar19 + 0xffffffffffffffff) + 0x1010);
                              pgVar19->alignment =
                                   *(size_t *)((long)(pgVar19 + 0xffffffffffffffff) + 0x1008);
                              *(size_t *)&pgVar19->n_free_blocks = sVar6;
                              pgVar19 = (ggml_dyn_tallocr *)
                                        ((long)(pgVar19 + 0xffffffffffffffff) + 0x1008);
                            } while ((long)uVar24 < (long)uVar10);
                            uVar7 = pgVar3->n_free_blocks;
                          }
                          goto LAB_001241d4;
                        }
                        uVar24 = uVar24 + 1;
                        pfVar18 = pfVar18 + 1;
                      } while (uVar10 != uVar24);
                      uVar24 = (ulong)uVar7;
                    }
LAB_001241d4:
                    pfVar1[uVar24 & 0xffffffff].offset = uVar17;
                    pgVar3->free_blocks[uVar24 & 0xffffffff].size = sVar13;
                    pgVar3->n_free_blocks = uVar7 + 1;
LAB_001241ed:
                    phVar9->allocated = false;
                  }
                }
              }
            }
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 10);
        lVar25 = lVar25 + 1;
        iVar21 = graph->n_nodes;
      } while (lVar25 < iVar21);
    }
  }
  if (galloc->n_nodes < iVar21) {
    free(galloc->node_allocs);
    iVar21 = graph->n_nodes;
    pnVar11 = (node_alloc *)calloc((long)iVar21,0x108);
    galloc->node_allocs = pnVar11;
    if (pnVar11 == (node_alloc *)0x0) {
      pcVar15 = "galloc->node_allocs != NULL";
      iVar21 = 0x2bd;
      goto LAB_001246ab;
    }
  }
  galloc->n_nodes = iVar21;
  if (0 < iVar21) {
    lVar25 = 0x18;
    lVar22 = 0;
    do {
      pgVar4 = graph->nodes[lVar22];
      pnVar11 = galloc->node_allocs;
      pnVar30 = pnVar11 + lVar22;
      if ((pgVar4->view_src == (ggml_tensor *)0x0) && (pgVar4->data == (void *)0x0)) {
        phVar9 = ggml_gallocr_hash_get(galloc,pgVar4);
        iVar21 = phVar9->buffer_id;
        (pnVar30->dst).buffer_id = iVar21;
        (pnVar30->dst).offset = phVar9->offset;
        sVar13 = ggml_backend_buft_get_alloc_size(galloc->bufts[iVar21],pgVar4);
      }
      else {
        (pnVar30->dst).buffer_id = -1;
        (pnVar30->dst).offset = 0xffffffffffffffff;
        sVar13 = 0;
      }
      (pnVar30->dst).size_max = sVar13;
      piVar23 = (int *)((long)&(((node_alloc *)(pnVar11->src + -1))->dst).buffer_id + lVar25);
      lVar31 = 0;
      do {
        pgVar5 = pgVar4->src[lVar31];
        if (((pgVar5 == (ggml_tensor *)0x0) || (pgVar5->view_src != (ggml_tensor *)0x0)) ||
           (pgVar5->data != (void *)0x0)) {
          *piVar23 = -1;
          piVar23[2] = -1;
          piVar23[3] = -1;
          sVar13 = 0;
        }
        else {
          phVar9 = ggml_gallocr_hash_get(galloc,pgVar5);
          iVar21 = phVar9->buffer_id;
          *piVar23 = iVar21;
          *(size_t *)(piVar23 + 2) = phVar9->offset;
          sVar13 = ggml_backend_buft_get_alloc_size(galloc->bufts[iVar21],pgVar5);
        }
        *(size_t *)(piVar23 + 4) = sVar13;
        lVar31 = lVar31 + 1;
        piVar23 = piVar23 + 6;
      } while (lVar31 != 10);
      lVar22 = lVar22 + 1;
      lVar25 = lVar25 + 0x108;
    } while (lVar22 < graph->n_nodes);
  }
  iVar21 = graph->n_leafs;
  if (galloc->n_leafs < iVar21) {
    free(galloc->leaf_allocs);
    iVar21 = graph->n_leafs;
    plVar12 = (leaf_alloc *)calloc((long)iVar21,0x18);
    galloc->leaf_allocs = plVar12;
    if (plVar12 == (leaf_alloc *)0x0) {
      pcVar15 = "galloc->leaf_allocs != NULL";
      iVar21 = 0x2de;
LAB_001246ab:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c"
                 ,iVar21,"GGML_ASSERT(%s) failed",pcVar15);
    }
  }
  galloc->n_leafs = iVar21;
  if (0 < iVar21) {
    lVar22 = 0;
    lVar25 = 0;
    do {
      pgVar4 = graph->leafs[lVar25];
      phVar9 = ggml_gallocr_hash_get(galloc,pgVar4);
      if ((pgVar4->view_src == (ggml_tensor *)0x0) && (pgVar4->data == (void *)0x0)) {
        iVar21 = phVar9->buffer_id;
        plVar12 = galloc->leaf_allocs;
        *(int *)((long)&(plVar12->leaf).buffer_id + lVar22) = iVar21;
        *(size_t *)((long)&(plVar12->leaf).offset + lVar22) = phVar9->offset;
        sVar13 = ggml_backend_buft_get_alloc_size(galloc->bufts[iVar21],pgVar4);
        plVar12 = galloc->leaf_allocs;
      }
      else {
        plVar12 = galloc->leaf_allocs;
        *(undefined4 *)((long)&(plVar12->leaf).buffer_id + lVar22) = 0xffffffff;
        *(undefined8 *)((long)&(plVar12->leaf).offset + lVar22) = 0xffffffffffffffff;
        sVar13 = 0;
      }
      *(size_t *)((long)&(plVar12->leaf).size_max + lVar22) = sVar13;
      lVar25 = lVar25 + 1;
      lVar22 = lVar22 + 0x18;
    } while (lVar25 < graph->n_leafs);
  }
  if (0 < galloc->n_buffers) {
    lVar25 = 0;
    do {
      if (lVar25 != 0) {
        lVar22 = 0;
        do {
          if (galloc->buf_tallocs[lVar22] == galloc->buf_tallocs[lVar25]) {
            galloc->buffers[lVar25] = galloc->buffers[lVar22];
            break;
          }
          lVar22 = lVar22 + 1;
        } while (lVar25 != lVar22);
      }
      ppgVar20 = galloc->buffers;
      if (ppgVar20[lVar25] == (ggml_backend_buffer_t)0x0) {
        uVar17 = 0;
      }
      else {
        uVar17 = ggml_backend_buffer_get_size(ppgVar20[lVar25]);
        ppgVar20 = galloc->buffers;
      }
      uVar10 = galloc->buf_tallocs[lVar25]->max_size;
      pgVar14 = ppgVar20[lVar25];
      if (uVar17 < uVar10) {
LAB_0012459d:
        ggml_backend_buffer_free(pgVar14);
        pgVar14 = ggml_backend_buft_alloc_buffer(galloc->bufts[lVar25],uVar10);
        galloc->buffers[lVar25] = pgVar14;
        if (galloc->buffers[lVar25] == (ggml_backend_buffer_t)0x0) {
          pcVar15 = ggml_backend_buft_name(galloc->bufts[lVar25]);
          ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate %s buffer of size %zu\n",
                            "ggml_gallocr_reserve_n",pcVar15,uVar10);
          return false;
        }
        ggml_backend_buffer_set_usage(galloc->buffers[lVar25],GGML_BACKEND_BUFFER_USAGE_COMPUTE);
      }
      else if (pgVar14 == (ggml_backend_buffer_t)0x0) {
        pgVar14 = (ggml_backend_buffer_t)0x0;
        goto LAB_0012459d;
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 < galloc->n_buffers);
  }
  return true;
}

Assistant:

bool ggml_gallocr_reserve_n(ggml_gallocr_t galloc, struct ggml_cgraph * graph, const int * node_buffer_ids, const int * leaf_buffer_ids) {
    size_t min_hash_size = graph->n_nodes + graph->n_leafs;
    // add 25% margin to avoid hash collisions
    min_hash_size += min_hash_size / 4;

    // initialize hash table
    if (galloc->hash_set.size < min_hash_size) {
        ggml_hash_set_free(&galloc->hash_set);
        galloc->hash_set = ggml_hash_set_new(min_hash_size);
        GGML_ASSERT(galloc->hash_set.keys != NULL);

        free(galloc->hash_values);
        galloc->hash_values = malloc(sizeof(struct hash_node) * galloc->hash_set.size);
        GGML_ASSERT(galloc->hash_values != NULL);
    }

    // reset allocators
    for (int i = 0; i < galloc->n_buffers; i++) {
        ggml_dyn_tallocr_reset(galloc->buf_tallocs[i]);
    }

    // allocate in hash table
    ggml_gallocr_alloc_graph_impl(galloc, graph, node_buffer_ids, leaf_buffer_ids);

    // set the node_allocs from the hash table
    if (galloc->n_nodes < graph->n_nodes) {
        free(galloc->node_allocs);
        galloc->node_allocs = calloc(graph->n_nodes, sizeof(struct node_alloc));
        GGML_ASSERT(galloc->node_allocs != NULL);
    }
    galloc->n_nodes = graph->n_nodes;
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        struct node_alloc * node_alloc = &galloc->node_allocs[i];
        if (node->view_src || node->data) {
            node_alloc->dst.buffer_id = -1;
            node_alloc->dst.offset = SIZE_MAX;
            node_alloc->dst.size_max = 0;
        } else {
            struct hash_node * hn = ggml_gallocr_hash_get(galloc, node);
            node_alloc->dst.buffer_id = hn->buffer_id;
            node_alloc->dst.offset    = hn->offset;
            node_alloc->dst.size_max  = ggml_backend_buft_get_alloc_size(galloc->bufts[hn->buffer_id], node);
        }
        for (int j = 0; j < GGML_MAX_SRC; j++) {
            struct ggml_tensor * src = node->src[j];
            if (!src || src->view_src || src->data) {
                node_alloc->src[j].buffer_id = -1;
                node_alloc->src[j].offset = SIZE_MAX;
                node_alloc->src[j].size_max = 0;
            } else {
                struct hash_node * hn = ggml_gallocr_hash_get(galloc, src);
                node_alloc->src[j].buffer_id = hn->buffer_id;
                node_alloc->src[j].offset   = hn->offset;
                node_alloc->src[j].size_max = ggml_backend_buft_get_alloc_size(galloc->bufts[hn->buffer_id], src);
            }
        }
    }
    if (galloc->n_leafs < graph->n_leafs) {
        free(galloc->leaf_allocs);
        galloc->leaf_allocs = calloc(graph->n_leafs, sizeof(galloc->leaf_allocs[0]));
        GGML_ASSERT(galloc->leaf_allocs != NULL);
    }
    galloc->n_leafs = graph->n_leafs;
    for (int i = 0; i < graph->n_leafs; i++) {
        struct ggml_tensor * leaf = graph->leafs[i];
        struct hash_node * hn = ggml_gallocr_hash_get(galloc, leaf);
        if (leaf->view_src || leaf->data) {
            galloc->leaf_allocs[i].leaf.buffer_id = -1;
            galloc->leaf_allocs[i].leaf.offset = SIZE_MAX;
            galloc->leaf_allocs[i].leaf.size_max = 0;
        } else {
            galloc->leaf_allocs[i].leaf.buffer_id = hn->buffer_id;
            galloc->leaf_allocs[i].leaf.offset = hn->offset;
            galloc->leaf_allocs[i].leaf.size_max = ggml_backend_buft_get_alloc_size(galloc->bufts[hn->buffer_id], leaf);
        }
    }

    // reallocate buffers if needed
    for (int i = 0; i < galloc->n_buffers; i++) {
        // if the buffer type is used multiple times, we reuse the same buffer
        for (int j = 0; j < i; j++) {
            if (galloc->buf_tallocs[j] == galloc->buf_tallocs[i]) {
                galloc->buffers[i] = galloc->buffers[j];
                break;
            }
        }

        size_t cur_size = galloc->buffers[i] ? ggml_backend_buffer_get_size(galloc->buffers[i]) : 0;
        size_t new_size = ggml_dyn_tallocr_max_size(galloc->buf_tallocs[i]);

        // even if there are no tensors allocated in this buffer, we still need to allocate it to initialize views
        if (new_size > cur_size || galloc->buffers[i] == NULL) {
#ifndef NDEBUG
            GGML_LOG_DEBUG("%s: reallocating %s buffer from size %.02f MiB to %.02f MiB\n", __func__, ggml_backend_buft_name(galloc->bufts[i]), cur_size / 1024.0 / 1024.0, new_size / 1024.0 / 1024.0);
#endif

            ggml_backend_buffer_free(galloc->buffers[i]);
            galloc->buffers[i] = ggml_backend_buft_alloc_buffer(galloc->bufts[i], new_size);
            if (galloc->buffers[i] == NULL) {
                GGML_LOG_ERROR("%s: failed to allocate %s buffer of size %zu\n", __func__, ggml_backend_buft_name(galloc->bufts[i]), new_size);
                return false;
            }
            ggml_backend_buffer_set_usage(galloc->buffers[i], GGML_BACKEND_BUFFER_USAGE_COMPUTE);
        }
    }

    return true;
}